

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_Pulse.c
# Opt level: O0

UINT8 Pulse_Start(void *drvObj,UINT32 deviceID,AUDIO_OPTS *options,void *audDrvParam)

{
  undefined1 auVar1 [16];
  UINT8 UVar2;
  undefined8 uVar3;
  void *pvVar4;
  undefined4 local_48;
  UINT8 retVal8;
  UINT64 tempInt64;
  DRV_PULSE *drv;
  void *audDrvParam_local;
  AUDIO_OPTS *options_local;
  UINT32 deviceID_local;
  void *drvObj_local;
  
  if (*(char *)((long)drvObj + 8) == '\0') {
    *(void **)drvObj = audDrvParam;
    audDrvParam_local = options;
    if (options == (AUDIO_OPTS *)0x0) {
      audDrvParam_local = &defOptions;
    }
    *(undefined1 *)((long)drvObj + 0x14) = *(undefined1 *)((long)audDrvParam_local + 4);
    *(undefined4 *)((long)drvObj + 0x10) = *audDrvParam_local;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (ulong)*audDrvParam_local * (ulong)*(uint *)((long)audDrvParam_local + 8) +
                   500000;
    *(int *)((long)drvObj + 0x18) = SUB164(auVar1 / ZEXT816(1000000),0);
    *(uint *)((long)drvObj + 0x1c) =
         (((uint)*(byte *)((long)audDrvParam_local + 5) * (uint)*(byte *)((long)drvObj + 0x14)) / 8)
         * *(int *)((long)drvObj + 0x18);
    if (*(int *)((long)audDrvParam_local + 0xc) == 0) {
      local_48 = 10;
    }
    else {
      local_48 = *(undefined4 *)((long)audDrvParam_local + 0xc);
    }
    *(undefined4 *)((long)drvObj + 0x20) = local_48;
    if (*(char *)((long)audDrvParam_local + 5) == '\b') {
      *(undefined4 *)((long)drvObj + 0xc) = 0;
    }
    else if (*(char *)((long)audDrvParam_local + 5) == '\x10') {
      *(undefined4 *)((long)drvObj + 0xc) = 3;
    }
    else if (*(char *)((long)audDrvParam_local + 5) == '\x18') {
      *(undefined4 *)((long)drvObj + 0xc) = 9;
    }
    else {
      if (*(char *)((long)audDrvParam_local + 5) != ' ') {
        return 0xcf;
      }
      *(undefined4 *)((long)drvObj + 0xc) = 7;
    }
    *(undefined1 *)((long)drvObj + 0x51) = 1;
    uVar3 = pa_simple_new(0,"libvgm",1,0,*(undefined8 *)((long)drvObj + 0x58),(long)drvObj + 0xc,0,0
                          ,0);
    *(undefined8 *)((long)drvObj + 0x48) = uVar3;
    if (*(long *)((long)drvObj + 0x48) == 0) {
      drvObj_local._7_1_ = 0xc0;
    }
    else {
      OSSignal_Reset(*(OS_SIGNAL **)((long)drvObj + 0x38));
      UVar2 = OSThread_Init((OS_THREAD **)((long)drvObj + 0x30),PulseThread,drvObj);
      if (UVar2 == '\0') {
        pvVar4 = malloc((ulong)*(uint *)((long)drvObj + 0x1c));
        *(void **)((long)drvObj + 0x28) = pvVar4;
        *(undefined1 *)((long)drvObj + 8) = 1;
        *(undefined1 *)((long)drvObj + 0x50) = 0;
        OSSignal_Signal(*(OS_SIGNAL **)((long)drvObj + 0x38));
        drvObj_local._7_1_ = '\0';
      }
      else {
        pa_simple_free(*(undefined8 *)((long)drvObj + 0x48));
        drvObj_local._7_1_ = 200;
      }
    }
  }
  else {
    drvObj_local._7_1_ = 0xd0;
  }
  return drvObj_local._7_1_;
}

Assistant:

UINT8 Pulse_Start(void* drvObj, UINT32 deviceID, AUDIO_OPTS* options, void* audDrvParam)
{
	DRV_PULSE* drv = (DRV_PULSE*)drvObj;
	UINT64 tempInt64;
	UINT8 retVal8;
	
	if (drv->devState != 0)
		return 0xD0;	// already running
	
	drv->audDrvPtr = audDrvParam;
	if (options == NULL)
		options = &defOptions;
	drv->pulseFmt.channels = options->numChannels;
	drv->pulseFmt.rate = options->sampleRate;
	
	tempInt64 = (UINT64)options->sampleRate * options->usecPerBuf;
	drv->bufSmpls = (UINT32)((tempInt64 + 500000) / 1000000);
	drv->bufSize = (options->numBitsPerSmpl * drv->pulseFmt.channels / 8) * drv->bufSmpls;
	drv->bufCount = options->numBuffers ? options->numBuffers : 10;
	
	if (options->numBitsPerSmpl == 8)
		drv->pulseFmt.format = PA_SAMPLE_U8;
	else if (options->numBitsPerSmpl == 16)
		drv->pulseFmt.format = PA_SAMPLE_S16NE;
	else if (options->numBitsPerSmpl == 24)
		drv->pulseFmt.format = PA_SAMPLE_S24NE;
	else if (options->numBitsPerSmpl == 32)
		drv->pulseFmt.format = PA_SAMPLE_S32NE;
	else
		return 0xCF;
	
	drv->canPause = 1;
	
	drv->hPulse = pa_simple_new(NULL, "libvgm", PA_STREAM_PLAYBACK, NULL, drv->streamDesc, &drv->pulseFmt, NULL, NULL, NULL);
	if(!drv->hPulse)
		return 0xC0;
	
	OSSignal_Reset(drv->hSignal);
	retVal8 = OSThread_Init(&drv->hThread, &PulseThread, drv);
	if (retVal8)
	{
		pa_simple_free(drv->hPulse);
		return 0xC8;	// CreateThread failed
	}
	
	drv->bufSpace = (UINT8*)malloc(drv->bufSize);
	
	drv->devState = 1;
	drv->pauseThread = 0x00;
	OSSignal_Signal(drv->hSignal);
	
	return AERR_OK;
}